

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.h
# Opt level: O3

void __thiscall google::protobuf::util::converter::DefaultValueObjectWriter::Node::~Node(Node *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  pointer ppNVar3;
  pointer ppNVar4;
  ulong uVar5;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_003bcc98;
  ppNVar3 = (this->children_).
            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppNVar4 = (this->children_).
            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar4 != ppNVar3) {
    uVar5 = 0;
    do {
      if (ppNVar3[uVar5] != (Node *)0x0) {
        (*ppNVar3[uVar5]->_vptr_Node[1])();
        ppNVar3 = (this->children_).
                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppNVar4 = (this->children_).
                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppNVar4 - (long)ppNVar3 >> 3));
  }
  p_Var1 = (this->field_scrub_callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->field_scrub_callback_,(_Any_data *)&this->field_scrub_callback_,
              __destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->path_);
  ppNVar3 = (this->children_).
            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppNVar3 != (pointer)0x0) {
    operator_delete(ppNVar3);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Node() {
      for (int i = 0; i < children_.size(); ++i) {
        delete children_[i];
      }
    }